

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectionAddressFilter.cpp
# Opt level: O0

void __thiscall
KDIS::NETWORK::ConnectionAddressFilter::ConnectionAddressFilter
          (ConnectionAddressFilter *this,FilterMode FM)

{
  FilterMode FM_local;
  ConnectionAddressFilter *this_local;
  
  ConnectionSubscriber::ConnectionSubscriber(&this->super_ConnectionSubscriber);
  (this->super_ConnectionSubscriber)._vptr_ConnectionSubscriber =
       (_func_int **)&PTR__ConnectionAddressFilter_0032db80;
  this->m_FM = FM;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_Filter);
  return;
}

Assistant:

ConnectionAddressFilter::ConnectionAddressFilter( FilterMode FM /* = AllowAddressesInFilterList */ ) :
	m_FM( FM )
{
}